

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LowerInlineBuiltIn(Lowerer *this,Instr *builtInEndInstr)

{
  undefined2 uVar1;
  Opnd *this_00;
  _func_int **pp_Var2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  undefined4 *puVar6;
  StackSym *pSVar7;
  Instr *pIVar8;
  Instr *pIVar9;
  Instr *this_01;
  
  uVar1 = builtInEndInstr->m_opcode;
  if (1 < (ushort)(uVar1 - 0x24d)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2ef9,
                       "(builtInEndInstr->m_opcode == Js::OpCode::InlineBuiltInEnd || builtInEndInstr->m_opcode == Js::OpCode::InlineNonTrackingBuiltInEnd)"
                       ,
                       "builtInEndInstr->m_opcode == Js::OpCode::InlineBuiltInEnd || builtInEndInstr->m_opcode == Js::OpCode::InlineNonTrackingBuiltInEnd"
                      );
    if (!bVar4) goto LAB_005c560c;
    *puVar6 = 0;
  }
  pSVar7 = IR::Opnd::GetStackSym(builtInEndInstr->m_src2);
  if (((pSVar7->field_0x18 & 1) == 0) || ((pSVar7->field_5).m_instrDef == (Instr *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar4) {
LAB_005c560c:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pIVar8 = (pSVar7->field_5).m_instrDef;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  this_01 = (Instr *)0x0;
  do {
    if (pIVar8->m_src2 == (Opnd *)0x0) {
LAB_005c5580:
      pIVar9 = (Instr *)0x0;
    }
    else {
      OVar5 = IR::Opnd::GetKind(pIVar8->m_src2);
      if (OVar5 != OpndKindSym) goto LAB_005c5580;
      this_00 = pIVar8->m_src2;
      OVar5 = IR::Opnd::GetKind(this_00);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_005c560c;
        *puVar6 = 0;
      }
      pp_Var2 = this_00[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar4) goto LAB_005c560c;
        *puVar6 = 0;
      }
      if (((*(byte *)((long)pp_Var2 + 0x1a) & 0x10) != 0) && (*(short *)((long)pp_Var2 + 0x16) == 0)
         ) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar4) goto LAB_005c560c;
        *puVar6 = 0;
      }
      if ((*(byte *)((long)pp_Var2 + 0x1a) & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar4) goto LAB_005c560c;
        *puVar6 = 0;
      }
      if ((((ulong)pp_Var2[3] & 1) == 0) || (pp_Var2[5] == (_func_int *)0x0)) {
        bVar4 = Func::IsInPhase(builtInEndInstr->m_func,FGPeepsPhase);
        if (!bVar4) {
          bVar4 = Func::IsInPhase(builtInEndInstr->m_func,FGBuildPhase);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar4) goto LAB_005c560c;
            *puVar6 = 0;
          }
        }
      }
      if (((ulong)pp_Var2[3] & 1) == 0) goto LAB_005c5580;
      pIVar9 = (Instr *)pp_Var2[5];
    }
    if (pIVar8->m_opcode != ArgOut_A_InlineSpecialized) {
      if (pIVar8->m_opcode == StartCall) {
        if (pIVar9 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar4) goto LAB_005c560c;
          *puVar6 = 0;
        }
        break;
      }
      pSVar7 = IR::Opnd::GetStackSym(pIVar8->m_src2);
      this_01 = (pSVar7->field_5).m_instrDef;
    }
    pIVar8 = pIVar9;
  } while (pIVar9 != (Instr *)0x0);
  IR::Instr::Unlink(this_01);
  IR::Instr::Remove(builtInEndInstr);
  return;
}

Assistant:

void Lowerer::LowerInlineBuiltIn(IR::Instr* builtInEndInstr)
{
    Assert(builtInEndInstr->m_opcode == Js::OpCode::InlineBuiltInEnd || builtInEndInstr->m_opcode == Js::OpCode::InlineNonTrackingBuiltInEnd);
    IR::Instr* startCallInstr = nullptr;
    builtInEndInstr->IterateArgInstrs([&](IR::Instr* argInstr) {
        startCallInstr = argInstr->GetSrc2()->GetStackSym()->m_instrDef;
        return false;
    });
    // Keep the startCall around as bailout refers to it. Just unlink it for now - do not delete it.
    startCallInstr->Unlink();
    builtInEndInstr->Remove();
}